

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaDevice.cpp
# Opt level: O0

void __thiscall xmrig::CudaDevice::toJSON(CudaDevice *this,Value *out,Document *doc)

{
  bool bVar1;
  reference puVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RSI;
  CudaDevice *in_RDI;
  uint speed;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Value fanSpeed;
  Value health;
  NvmlHealth data;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined4 in_stack_fffffffffffffdc8;
  Type in_stack_fffffffffffffdcc;
  CudaDevice *in_stack_fffffffffffffdd0;
  Document *in_stack_fffffffffffffde0;
  String *in_stack_fffffffffffffde8;
  PciTopology *in_stack_fffffffffffffdf8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericStringRef<char> *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_01;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffe18;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe20;
  uint value_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *value;
  StringRefType *in_stack_fffffffffffffe28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe30;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_02;
  GenericStringRef<char> local_198;
  GenericStringRef<char> local_188;
  uint local_174;
  uint *local_170;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_168;
  void **local_160;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_158;
  GenericStringRef<char> local_148;
  GenericStringRef<char> local_138;
  GenericStringRef<char> local_128;
  GenericStringRef<char> local_118;
  MemoryPoolAllocator<rapidjson::CrtAllocator> local_108;
  GenericStringRef<char> local_d0;
  GenericStringRef<char> local_c0;
  GenericStringRef<char> local_b0;
  GenericStringRef<char> local_a0;
  GenericStringRef<char> local_90 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_70;
  GenericStringRef<char> local_60 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  GenericStringRef<char> local_30;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_10;
  
  local_10 = in_RSI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_30,(char (*) [5])"name");
  CudaDevice::name(in_RDI);
  String::toJSON(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_40);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(local_60,(char (*) [7])"bus_id");
  topology(in_RDI);
  PciTopology::toString(in_stack_fffffffffffffdf8);
  String::toJSON(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  value_00 = (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_70);
  String::~String((String *)in_stack_fffffffffffffdd0);
  this_01 = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(local_90,(char (*) [4])"smx");
  smx((CudaDevice *)0x22a0cc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,value_00,in_stack_fffffffffffffe18)
  ;
  allocator_01 = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_a0,(char (*) [5])"arch");
  arch(in_stack_fffffffffffffdd0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,value_00,allocator_01)
  ;
  value = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_b0,(char (*) [11])"global_mem");
  globalMemSize((CudaDevice *)0x22a160);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(unsigned_long)value,allocator_01);
  name = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_c0,(char (*) [6])0x27e997);
  clock(in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_fffffffffffffe30,(StringRefType *)name,(uint)((ulong)value >> 0x20),
             allocator_01);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_d0,(char (*) [13])"memory_clock");
  memoryClock((CudaDevice *)0x22a1f5);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_10,(StringRefType *)name,(uint)((ulong)value >> 0x20),allocator_01);
  if (in_RDI->m_nvmlDevice != (nvmlDevice_t)0x0) {
    NvmlLib::health((nvmlDevice_t)in_stack_fffffffffffffdf8);
    allocator_00 = &local_108;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    this_00 = &local_118;
    rapidjson::GenericStringRef<char>::GenericStringRef<12u>(this_00,(char (*) [12])"temperature");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_10,(StringRefType *)name,(uint)((ulong)value >> 0x20),allocator_01);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_128,(char (*) [6])"power");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_10,(StringRefType *)name,(uint)((ulong)value >> 0x20),allocator_01);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_138,(char (*) [6])0x27e997);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_10,(StringRefType *)name,(uint)((ulong)value >> 0x20),allocator_01);
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_148,(char (*) [10])"mem_clock");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_10,(StringRefType *)name,(uint)((ulong)value >> 0x20),allocator_01);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    local_160 = &local_108.userBuffer_;
    local_168._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_170 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    this_02 = local_10;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_fffffffffffffdd0,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_168);
      local_174 = *puVar2;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this_01,(uint)((ulong)this_00 >> 0x20),allocator_00);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_168);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_188,(char (*) [10])"fan_speed");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this_02,(StringRefType *)name,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)value,allocator_01);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_198,(char (*) [7])"health");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this_02,(StringRefType *)name,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)value,allocator_01);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_158);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_108);
    NvmlHealth::~NvmlHealth((NvmlHealth *)0x22a549);
  }
  return;
}

Assistant:

void xmrig::CudaDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("name",           name().toJSON(doc), allocator);
    out.AddMember("bus_id",         topology().toString().toJSON(doc), allocator);
    out.AddMember("smx",            smx(), allocator);
    out.AddMember("arch",           arch(), allocator);
    out.AddMember("global_mem",     static_cast<uint64_t>(globalMemSize()), allocator);
    out.AddMember("clock",          clock(), allocator);
    out.AddMember("memory_clock",   memoryClock(), allocator);

#   ifdef XMRIG_FEATURE_NVML
    if (m_nvmlDevice) {
        auto data = NvmlLib::health(m_nvmlDevice);

        Value health(kObjectType);
        health.AddMember("temperature", data.temperature, allocator);
        health.AddMember("power",       data.power, allocator);
        health.AddMember("clock",       data.clock, allocator);
        health.AddMember("mem_clock",   data.memClock, allocator);

        Value fanSpeed(kArrayType);
        for (auto speed : data.fanSpeed) {
            fanSpeed.PushBack(speed, allocator);
        }
        health.AddMember("fan_speed", fanSpeed, allocator);

        out.AddMember("health", health, allocator);
    }
#   endif
}